

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O3

void Nf_ManComputeMappingEla(Nf_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  uint *puVar2;
  int *piVar3;
  Nf_Obj_t *pNVar4;
  void *pvVar5;
  Mio_Cell2_t *pMVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  long lVar9;
  bool bVar10;
  long lVar11;
  ulong uVar12;
  word wVar13;
  word wVar14;
  Gia_Man_t *pGVar15;
  byte bVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  int iVar26;
  uint uVar27;
  Nf_Mat_t *pNVar28;
  undefined1 *puVar29;
  Nf_Mat_t *pNVar30;
  undefined1 *puVar31;
  bool bVar32;
  Nf_Mat_t Mb;
  Nf_Mat_t local_48;
  ulong local_38;
  
  Nf_ManSetOutputRequireds(p,1);
  Nf_ManResetMatches(p,p->Iter - p->pPars->nRounds);
  pGVar15 = p->pGia;
  lVar24 = (long)pGVar15->nObjs;
  if (1 < (long)pGVar15->nObjs) {
    do {
      pGVar15 = p->pGia;
      if (pGVar15->nObjs < lVar24) goto LAB_00739a31;
      if (pGVar15->pObjs == (Gia_Obj_t *)0x0) goto LAB_007398b7;
      lVar11 = lVar24 + -1;
      pGVar1 = pGVar15->pObjs + lVar11;
      uVar23 = *(ulong *)pGVar1;
      uVar17 = (uint)uVar23;
      if ((~uVar17 & 0x1fffffff) != 0 && -1 < (int)uVar17) {
        uVar17 = uVar17 & 0x1fffffff;
        uVar12 = lVar11 * 2;
        iVar19 = (int)lVar11;
        if ((uVar17 == 0x1fffffff) || (uVar17 != ((uint)(uVar23 >> 0x20) & 0x1fffffff))) {
          local_38 = uVar12 & 0xffffffff;
          uVar23 = 0;
          bVar32 = true;
          do {
            bVar10 = bVar32;
            uVar12 = uVar23 | local_38;
            if ((p->vMapRefs).nSize <= (int)uVar12) goto LAB_00739958;
            if ((p->vMapRefs).pArray[uVar12] != 0) {
              pNVar4 = p->pNfObjs;
              uVar17 = *(uint *)pNVar4[lVar11].M[uVar23];
              uVar18 = *(uint *)(pNVar4[lVar11].M[uVar23] + 1);
              if (-1 < (int)(uVar18 ^ uVar17)) {
LAB_00739977:
                __assert_fail("pD->fBest != pA->fBest",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                              ,0x57b,"Nf_Mat_t *Nf_ObjMatchBest(Nf_Man_t *, int, int)");
              }
              pNVar30 = (Nf_Mat_t *)0x0;
              if ((int)uVar17 < 0) {
                pNVar30 = pNVar4[lVar11].M[uVar23];
              }
              if ((int)uVar18 < 0) {
                pNVar30 = pNVar4[lVar11].M[uVar23] + 1;
              }
              if ((p->vRequired).nSize <= (int)uVar12) goto LAB_00739958;
              iVar21 = (p->vRequired).pArray[uVar12];
              if (iVar21 < pNVar30->D) {
                __assert_fail("pM->D <= Required",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                              ,0x7aa,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
              }
              if ((pNVar30->field_0x3 & 0x40) == 0) {
                iVar26 = (int)uVar23;
                wVar13 = Nf_MatchDeref_rec(p,iVar19,iVar26,pNVar30);
                if (-1 < *(int *)pNVar30) {
                  __assert_fail("pM->fBest",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                                ,0x7b0,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
                }
                Nf_ManElaBestMatch(p,iVar19,iVar26,&local_48,iVar21);
                wVar14 = Nf_MatchRef_rec(p,iVar19,iVar26,&local_48,iVar21,(Vec_Int_t *)0x0);
                if (-1 < (int)local_48._0_4_) {
                  __assert_fail("pMb->fBest",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                                ,0x7c1,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
                }
                if (iVar21 < local_48.D) {
                  __assert_fail("pMb->D <= Required",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                                ,0x7c2,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
                }
                if (wVar13 < wVar14) {
                  __assert_fail("AreaBef >= AreaAft",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                                ,0x7c4,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
                }
                *(ulong *)pNVar30 = CONCAT44(local_48.Cfg,local_48._0_4_);
                pNVar30->D = local_48.D;
                pNVar30->F = local_48.F;
                if ((p->vCutSets).nSize < lVar24) goto LAB_00739958;
                uVar17 = (p->vCutSets).pArray[lVar11];
                uVar18 = (int)uVar17 >> 0x10;
                if (((int)uVar18 < 0) || ((p->vPages).nSize <= (int)uVar18)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                uVar20 = (uint)local_48._0_4_ >> 0x14 & 0x3ff;
                if (uVar20 == 0) {
                  __assert_fail("h > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                                ,0x93,"int *Nf_CutFromHandle(int *, int)");
                }
                uVar17 = uVar17 & 0xffff;
                pvVar5 = (p->vPages).pArray[uVar18];
                if ((*(byte *)((long)pvVar5 + (ulong)uVar20 * 4 + (ulong)uVar17 * 4) & 0x1f) != 0) {
                  pMVar6 = p->pCells;
                  puVar2 = (uint *)((long)pvVar5 + (ulong)uVar20 * 4 + (ulong)uVar17 * 4);
                  lVar9 = (ulong)((local_48._0_4_ & 0xfffff) * 0x50) + 0x2c;
                  bVar16 = 0;
                  uVar23 = 0;
                  do {
                    uVar17 = puVar2[(ulong)(((uint)local_48.Cfg >> 8) >> (bVar16 & 0x1f) & 0xf) + 1]
                    ;
                    lVar25 = (long)(int)uVar17;
                    if (lVar25 == 0) break;
                    bVar32 = (((uint)local_48.Cfg >> 1 & 0x7f) >> ((uint)uVar23 & 0x1f) & 1) != 0;
                    pNVar4 = p->pNfObjs;
                    uVar18 = *(uint *)pNVar4[lVar25].M[bVar32];
                    uVar20 = *(uint *)(pNVar4[lVar25].M[bVar32] + 1);
                    if (-1 < (int)(uVar20 ^ uVar18)) goto LAB_00739977;
                    if ((int)uVar18 < 0) {
                      pNVar30 = pNVar4[lVar25].M[bVar32];
                    }
                    else {
                      pNVar30 = (Nf_Mat_t *)0x0;
                    }
                    pNVar28 = pNVar4[lVar25].M[bVar32] + 1;
                    if (-1 < (int)uVar20) {
                      pNVar28 = pNVar30;
                    }
                    iVar26 = iVar21 - *(int *)((long)pMVar6->iDelays + uVar23 * 4 + lVar9 + -0x2c);
                    if (iVar26 < ((Nf_Mat_t *)&pNVar28->field_0x0)->D) {
                      __assert_fail("pM->D <= Required - pCell->iDelays[k]",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                                    ,0x7cc,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
                    }
                    if ((int)uVar17 < 0) goto LAB_00739996;
                    uVar18 = (uint)bVar32 + uVar17 * 2;
                    if ((p->vRequired).nSize <= (int)uVar18) goto LAB_00739958;
                    piVar3 = (p->vRequired).pArray;
                    if (iVar26 < piVar3[uVar18]) {
                      piVar3[uVar18] = iVar26;
                    }
                    if ((((Nf_Mat_t *)&pNVar28->field_0x0)->field_0x3 & 0x40) != 0) {
                      uVar27 = (bVar32 ^ 1) << 5;
                      uVar18 = *(uint *)(&pNVar4[lVar25].M[0][0].field_0x0 + uVar27);
                      uVar20 = *(uint *)(&pNVar4[lVar25].M[0][1].field_0x0 + uVar27);
                      if (-1 < (int)(uVar20 ^ uVar18)) goto LAB_00739977;
                      if ((int)uVar18 < 0) {
                        puVar31 = &pNVar4[lVar25].M[0][0].field_0x0 + uVar27;
                      }
                      else {
                        puVar31 = (undefined1 *)0x0;
                      }
                      puVar29 = &pNVar4[lVar25].M[0][1].field_0x0 + uVar27;
                      if (-1 < (int)uVar20) {
                        puVar29 = puVar31;
                      }
                      iVar26 = iVar21 - (*(int *)((long)pMVar6->iDelays + uVar23 * 4 + lVar9 + -0x2c
                                                 ) + p->InvDelayI);
                      if (iVar26 < *(int *)(puVar29 + 8)) {
                        __assert_fail("pM->D <= Required - pCell->iDelays[k] - p->InvDelayI",
                                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                                      ,0x7d1,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
                      }
                      uVar17 = bVar32 ^ 1 | uVar17 * 2;
                      if ((p->vRequired).nSize <= (int)uVar17) goto LAB_00739958;
                      if (iVar26 < piVar3[uVar17]) {
                        piVar3[uVar17] = iVar26;
                      }
                    }
                    uVar23 = uVar23 + 1;
                    bVar16 = bVar16 + 4;
                  } while (uVar23 < (*puVar2 & 0x1f));
                }
              }
            }
            uVar23 = 1;
            bVar32 = false;
          } while (bVar10);
        }
        else {
          uVar22 = uVar12 | 1;
          if ((long)(p->vMapRefs).nSize <= (long)uVar22) goto LAB_00739958;
          uVar18 = (p->vRequired).nSize;
          if ((p->vMapRefs).pArray[uVar22] != 0) {
            if ((long)(int)uVar18 <= (long)uVar22) goto LAB_00739958;
            piVar3 = (p->vRequired).pArray;
            iVar21 = piVar3[uVar22] - p->InvDelayI;
            if (iVar21 < piVar3[lVar11 * 2]) {
              piVar3[lVar11 * 2] = iVar21;
              uVar17 = *(uint *)pGVar1;
              uVar23 = (ulong)uVar17;
              uVar18 = (p->vRequired).nSize;
              uVar17 = uVar17 & 0x1fffffff;
            }
          }
          if ((long)(int)uVar18 <= (long)uVar12) goto LAB_00739958;
          if ((int)(iVar19 - uVar17) < 0) {
LAB_00739996:
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf1,"int Abc_Var2Lit(int, int)");
          }
          uVar17 = ((uint)(uVar23 >> 0x1d) & 1) + (iVar19 - uVar17) * 2;
          if (uVar18 <= uVar17) goto LAB_00739958;
          piVar3 = (p->vRequired).pArray;
          if (piVar3[lVar11 * 2] < piVar3[uVar17]) {
            piVar3[uVar17] = piVar3[lVar11 * 2];
          }
        }
      }
      bVar32 = 2 < lVar24;
      lVar24 = lVar11;
    } while (bVar32);
    pGVar15 = p->pGia;
  }
LAB_007398b7:
  pVVar7 = pGVar15->vCis;
  iVar19 = pVVar7->nSize;
  if (0 < iVar19) {
    piVar3 = pVVar7->pArray;
    iVar21 = 1;
    lVar24 = 0;
    do {
      uVar17 = piVar3[lVar24];
      uVar23 = (ulong)uVar17;
      if (((int)uVar17 < 0) || (pGVar15->nObjs <= (int)uVar17)) {
LAB_00739a31:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (uVar23 == 0) {
        return;
      }
      lVar11 = uVar23 * 2 + 1;
      if ((p->vMapRefs).nSize <= (int)lVar11) goto LAB_00739958;
      if ((p->vMapRefs).pArray[lVar11] != 0) {
        uVar17 = (p->vRequired).nSize;
        if (((int)uVar17 <= iVar21) || (uVar17 <= (uint)(uVar23 * 2))) {
LAB_00739958:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar8 = (p->vRequired).pArray;
        iVar26 = piVar8[lVar24 * 2 + 1] - p->InvDelayI;
        uVar23 = uVar23 * 2 & 0xffffffff;
        if (iVar26 < piVar8[uVar23]) {
          piVar8[uVar23] = iVar26;
          iVar19 = pVVar7->nSize;
        }
      }
      lVar24 = lVar24 + 1;
      iVar21 = iVar21 + 2;
    } while (lVar24 < iVar19);
  }
  return;
}

Assistant:

void Nf_ManComputeMappingEla( Nf_Man_t * p )
{
    int fVerbose = 0;
    Gia_Obj_t * pObj;
    Mio_Cell2_t * pCell;
    Nf_Mat_t Mb, * pMb = &Mb, * pM;
    word AreaBef, AreaAft, Gain = 0;
    int i, c, iVar, Id, fCompl, k, * pCut;
    int Required;
    Nf_ManSetOutputRequireds( p, 1 );
    Nf_ManResetMatches( p, p->Iter - p->pPars->nRounds );
    Gia_ManForEachAndReverse( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) )
        {
            if ( Nf_ObjMapRefNum(p, i, 1) )
                Nf_ObjUpdateRequired( p, i, 0, Nf_ObjRequired(p, i, 1) - p->InvDelayI );
            Nf_ObjUpdateRequired( p, Gia_ObjFaninId0(pObj, i), Gia_ObjFaninC0(pObj), Nf_ObjRequired(p, i, 0) );
            continue;
        }
        for ( c = 0; c < 2; c++ )
        if ( Nf_ObjMapRefNum(p, i, c) )
        {
            pM = Nf_ObjMatchBest( p, i, c );
            Required = Nf_ObjRequired( p, i, c );
            assert( pM->D <= Required );
            if ( pM->fCompl )
                continue;
            // search for a better match
            assert( !pM->fCompl );
            AreaBef = Nf_MatchDeref_rec( p, i, c, pM );
            assert( pM->fBest );
            Nf_ManElaBestMatch( p, i, c, pMb, Required );
            AreaAft = Nf_MatchRef_rec( p, i, c, pMb, Required, NULL );
            Gain += AreaBef - AreaAft;
            // print area recover progress
            if ( fVerbose && Nf_ManCell(p, pM->Gate)->pName != Nf_ManCell(p, pMb->Gate)->pName )
            {
                printf( "%4d (%d)  ", i, c );
                printf( "%8s ->%8s  ",         Nf_ManCell(p, pM->Gate)->pName, Nf_ManCell(p, pMb->Gate)->pName );
                printf( "%d -> %d  ",          Nf_ManCell(p, pM->Gate)->nFanins, Nf_ManCell(p, pMb->Gate)->nFanins );
                printf( "D: %7.2f -> %7.2f  ", Scl_Int2Flt(pM->D), Scl_Int2Flt(pMb->D) );
                printf( "R: %7.2f  ",          Required == SCL_INFINITY ? 9999.99 : Scl_Int2Flt(Required) );
                printf( "A: %7.2f -> %7.2f  ", Scl_Int2Flt((int)AreaBef), Scl_Int2Flt((int)AreaAft) );
                printf( "G: %7.2f (%7.2f) ",   Scl_Int2Flt((int)AreaBef - (int)AreaAft), Scl_Int2Flt((int)Gain) );
                printf( "\n" );
            }
            // set best match
            assert( pMb->fBest );
            assert( pMb->D <= Required );
            //assert( Scl_Flt2Int(pMb->F) == (int)AreaAft );
            assert( AreaBef >= AreaAft );
            *pM = *pMb;
            // update timing
            pCell = Nf_ManCell( p, pMb->Gate );
            pCut = Nf_CutFromHandle( Nf_ObjCutSet(p, i), pMb->CutH );
            Nf_CutForEachVarCompl( pCut, pMb->Cfg, iVar, fCompl, k )
            {
                pM = Nf_ObjMatchBest( p, iVar, fCompl );
                assert( pM->D <= Required - pCell->iDelays[k] );
                Nf_ObjUpdateRequired( p, iVar, fCompl, Required - pCell->iDelays[k] );
                if ( pM->fCompl )
                {
                    pM = Nf_ObjMatchBest( p, iVar, !fCompl );
                    assert( pM->D <= Required - pCell->iDelays[k] - p->InvDelayI );
                    Nf_ObjUpdateRequired( p, iVar, !fCompl, Required - pCell->iDelays[k] - p->InvDelayI );
                }
            }
        }
    }
    Gia_ManForEachCiId( p->pGia, Id, i )
        if ( Nf_ObjMapRefNum(p, Id, 1) )
        {
            Required = Nf_ObjRequired( p, i, 1 );
            Nf_ObjUpdateRequired( p, Id, 0, Required - p->InvDelayI );
        }
}